

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator++(BN *this)

{
  bool bVar1;
  int local_3c;
  reference local_38;
  unsigned_short *i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  BN *this_local;
  
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->ba);
  i = (unsigned_short *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->ba)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                *)&i);
    if (!bVar1) {
      local_3c = 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<int>
                (&this->ba,&local_3c);
      return this;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end1);
    *local_38 = *local_38 + 1;
    if (*local_38 != 0) break;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

BN & BN::operator ++()
{
    for (auto& i : ba) {
        ++i;
        if (i != 0)
            return *this;
    }
    ba.emplace_back(1);
    return *this;
}